

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O2

uint64_t __thiscall slang::ast::Type::getSelectableWidth(Type *this)

{
  SymbolKind SVar1;
  bitwidth_t bVar2;
  Type *this_00;
  char *pcVar3;
  
  this_00 = getCanonicalType(this);
  SVar1 = (this_00->super_Symbol).kind;
  if ((SVar1 == UnpackedUnionType) || (SVar1 == UnpackedStructType)) {
    pcVar3 = *(char **)&this_00[2].super_Symbol;
  }
  else if (SVar1 == FixedSizeUnpackedArrayType) {
    pcVar3 = this_00[1].super_Symbol.name._M_str;
  }
  else {
    bVar2 = getBitWidth(this_00);
    pcVar3 = (char *)(ulong)(bVar2 + (bVar2 == 0));
  }
  return (uint64_t)pcVar3;
}

Assistant:

uint64_t Type::getSelectableWidth() const {
    auto& ct = getCanonicalType();
    switch (ct.kind) {
        case SymbolKind::FixedSizeUnpackedArrayType:
            return ct.as<FixedSizeUnpackedArrayType>().selectableWidth;
        case SymbolKind::UnpackedStructType:
            return ct.as<UnpackedStructType>().selectableWidth;
        case SymbolKind::UnpackedUnionType:
            return ct.as<UnpackedUnionType>().selectableWidth;
        default:
            uint32_t width = ct.getBitWidth();
            return width > 0 ? width : 1;
    }
}